

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserScannerInterface.cpp
# Opt level: O0

Node * Lodtalk::AST::parseDoItFromFile(VMContext *context,FILE *input)

{
  int iVar1;
  undefined1 local_48 [8];
  ParserScannerExtraData extraData;
  yyscan_t scanner;
  FILE *input_local;
  VMContext *context_local;
  
  iVar1 = Lodtalk_lex_init(&extraData.context);
  if (iVar1 == 0) {
    memset(local_48,0,0x20);
    local_48._0_4_ = 0x118;
    extraData.astResult = (Node *)context;
    Lodtalk_set_extra((ParserScannerExtraData *)local_48,extraData.context);
    Lodtalk_set_in(input,extraData.context);
    context_local = (VMContext *)doParse(extraData.context,(ParserScannerExtraData *)local_48);
  }
  else {
    context_local = (VMContext *)0x0;
  }
  return (Node *)context_local;
}

Assistant:

Node *parseDoItFromFile(VMContext *context, FILE *input)
{
    yyscan_t scanner;
    if(Lodtalk_lex_init(&scanner))
        return nullptr;

    ParserScannerExtraData extraData;
    memset(&extraData, 0, sizeof(extraData));
    extraData.startToken = DO_IT;
    extraData.context = context;
    Lodtalk_set_extra(&extraData, scanner);
    Lodtalk_set_in(input, scanner);
	return doParse(scanner, &extraData);
}